

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::getDualUnboundednessDirection
          (Highs *this,bool *has_dual_unboundedness_direction,
          double *dual_unboundedness_direction_value)

{
  allocator_type *__a;
  reference pvVar1;
  long in_RDX;
  Highs *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  HighsInt in_stack_0000002c;
  vector<double,_std::allocator<double>_> *in_stack_00000030;
  HighsInt iCol;
  vector<double,_std::allocator<double>_> dual_unboundedness_direction;
  HighsStatus status;
  vector<double,_std::allocator<double>_> dual_ray_value;
  bool *in_stack_ffffffffffffff58;
  Highs *in_stack_ffffffffffffff60;
  Highs *this_00;
  undefined1 *__n;
  int local_74;
  vector<double,_std::allocator<double>_> local_70;
  int local_54;
  HighsStatus local_50;
  undefined1 local_39 [25];
  long local_20;
  Highs *local_18;
  HighsStatus local_4;
  
  if (in_RDX == 0) {
    local_4 = getDualRay(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(double *)0x48ef8e);
  }
  else {
    __a = (allocator_type *)
          (long)*(int *)((long)&in_RDI[0xd].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start + 4);
    __n = local_39;
    local_20 = in_RDX;
    local_18 = in_RSI;
    std::allocator<double>::allocator((allocator<double> *)0x48edfb);
    std::vector<double,_std::allocator<double>_>::vector(in_RDI,(size_type)__n,__a);
    std::allocator<double>::~allocator((allocator<double> *)0x48ee1b);
    this_00 = local_18;
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x48ee32);
    local_50 = getDualRay(this_00,in_stack_ffffffffffffff58,(double *)0x48ee44);
    if ((local_50 == kOk) && (((ulong)local_18->_vptr_Highs & 1) != 0)) {
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)0x48eebc);
      HighsSparseMatrix::productTransposeQuad
                ((HighsSparseMatrix *)
                 dual_unboundedness_direction.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
                 (vector<double,_std::allocator<double>_> *)
                 dual_unboundedness_direction.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start,in_stack_00000030,in_stack_0000002c);
      for (local_74 = 0;
          local_74 <
          *(int *)&in_RDI[0xd].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start; local_74 = local_74 + 1) {
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&local_70,(long)local_74);
        *(value_type *)(local_20 + (long)local_74 * 8) = *pvVar1;
      }
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)__a);
      local_54 = 0;
    }
    else {
      local_4 = kError;
      local_54 = 1;
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)__a);
    if (local_54 == 0) {
      local_4 = kOk;
    }
  }
  return local_4;
}

Assistant:

HighsStatus Highs::getDualUnboundednessDirection(
    bool& has_dual_unboundedness_direction,
    double* dual_unboundedness_direction_value) {
  if (dual_unboundedness_direction_value) {
    std::vector<double> dual_ray_value(this->model_.lp_.num_row_);
    HighsStatus status =
        getDualRay(has_dual_unboundedness_direction, dual_ray_value.data());
    if (status != HighsStatus::kOk || !has_dual_unboundedness_direction)
      return HighsStatus::kError;
    std::vector<double> dual_unboundedness_direction;
    this->model_.lp_.a_matrix_.productTransposeQuad(
        dual_unboundedness_direction, dual_ray_value);
    for (HighsInt iCol = 0; iCol < this->model_.lp_.num_col_; iCol++)
      dual_unboundedness_direction_value[iCol] =
          dual_unboundedness_direction[iCol];
  } else {
    return getDualRay(has_dual_unboundedness_direction, nullptr);
  }
  return HighsStatus::kOk;
}